

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

void __thiscall nuraft::buffer::get(buffer *this,ptr<buffer> *dst)

{
  uint uVar1;
  element_type *peVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  size_t __n;
  
  peVar2 = (dst->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = *(uint *)peVar2;
  uVar6 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar6 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar5 = (ulong)*(uint *)(peVar2 + 4);
    lVar3 = uVar5 + 8;
  }
  else {
    uVar5 = (ulong)(uVar1 >> 0x10);
    lVar3 = uVar5 + 4;
  }
  __n = (uVar6 & uVar1) - uVar5;
  if ((int)*(uint *)this < 0) {
    lVar4 = (ulong)*(uint *)(this + 4) + 8;
  }
  else {
    lVar4 = (ulong)(*(uint *)this >> 0x10) + 4;
  }
  memcpy(peVar2 + lVar3,this + lVar4,__n);
  if (*(int *)this < 0) {
    *(int *)(this + 4) = *(int *)(this + 4) + (int)__n;
  }
  else {
    *(short *)(this + 2) = (short)__n + (short)((uint)*(int *)this >> 0x10);
  }
  return;
}

Assistant:

void buffer::get(ptr<buffer>& dst) {
    size_t sz = dst->size() - dst->pos();
    ::memcpy(dst->data(), data(), sz);
    __mv_fw_block(this, sz);
}